

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteHelpRule
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  _Base_ptr *pp_Var1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratorTarget *this_00;
  pointer pcVar3;
  bool bVar4;
  TargetType TVar5;
  pointer ppcVar6;
  string *psVar7;
  pointer ppcVar8;
  ulong uVar9;
  pointer pbVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  allocator local_119;
  string name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string path;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var1 = &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,
             "The following are some of the valid targets for this Makefile:","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,"... all (the default if no target is provided)","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&emittedTargets,"... clean","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&emittedTargets,"... depend","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar9 = 0;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar6) {
    do {
      pcVar2 = (cmLocalUnixMakefileGenerator3 *)ppcVar6[uVar9];
      if ((pcVar2 == lg) ||
         (bVar4 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg), bVar4)) {
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  (&targets,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                             GeneratorTargets);
        ppcVar8 = targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            this_00 = *ppcVar8;
            TVar5 = cmGeneratorTarget::GetType(this_00);
            if (TVar5 < INTERFACE_LIBRARY) {
              psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
              pcVar3 = (psVar7->_M_dataplus)._M_p;
              name._M_dataplus._M_p = (pointer)&name.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&name,pcVar3,pcVar3 + psVar7->_M_string_length);
              pVar11 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)&emittedTargets,&name);
              if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::__cxx11::string::_M_replace
                          ((ulong)&path,0,(char *)path._M_string_length,0x527650);
                std::__cxx11::string::_M_append((char *)&path,(ulong)name._M_dataplus._M_p);
                std::__cxx11::string::string((string *)&local_68,path._M_dataplus._M_p,&local_119);
                cmLocalUnixMakefileGenerator3::AppendEcho
                          (lg,&commands,&local_68,EchoNormal,(EchoProgress *)0x0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  local_68.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            ppcVar8 = ppcVar8 + 1;
          } while (ppcVar8 !=
                   targets.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)targets.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)targets.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                                   LocalGenerators.
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar6 >> 3))
    ;
  }
  pbVar10 = (lg->LocalHelp).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 !=
      (lg->LocalHelp).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::_M_replace((ulong)&path,0,(char *)path._M_string_length,0x527650);
      std::__cxx11::string::_M_append((char *)&path,(ulong)(pbVar10->_M_dataplus)._M_p);
      std::__cxx11::string::string((string *)&name,path._M_dataplus._M_p,(allocator *)&local_68);
      cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&name,EchoNormal,(EchoProgress *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             (lg->LocalHelp).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"help","");
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (lg,ruleFileStream,"Help Target",&name,&no_depends,&commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ruleFileStream,"\n\n",2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedTargets._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path._M_dataplus._M_p != &path.field_2) {
    operator_delete(path._M_dataplus._M_p,
                    CONCAT71(path.field_2._M_allocated_capacity._1_7_,path.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteHelpRule
(std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3 *lg)
{
  // add the help target
  std::string path;
  std::vector<std::string> no_depends;
  std::vector<std::string> commands;
  lg->AppendEcho(commands,"The following are some of the valid targets "
                 "for this Makefile:");
  lg->AppendEcho(commands,"... all (the default if no target is provided)");
  lg->AppendEcho(commands,"... clean");
  lg->AppendEcho(commands,"... depend");

  // Keep track of targets already listed.
  std::set<std::string> emittedTargets;

  // for each local generator
  unsigned int i;
  cmLocalUnixMakefileGenerator3 *lg2;
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg2 =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);
    // for the passed in makefile or if this is the top Makefile wripte out
    // the targets
    if (lg2 == lg || lg->IsRootMakefile())
      {
      // for each target Generate the rule files for each target.
      std::vector<cmGeneratorTarget*> targets = lg2->GetGeneratorTargets();
      for(std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
          t != targets.end(); ++t)
        {
        cmGeneratorTarget* target = *t;
        cmState::TargetType type = target->GetType();
        if((type == cmState::EXECUTABLE) ||
           (type == cmState::STATIC_LIBRARY) ||
           (type == cmState::SHARED_LIBRARY) ||
           (type == cmState::MODULE_LIBRARY) ||
           (type == cmState::OBJECT_LIBRARY) ||
           (type == cmState::GLOBAL_TARGET) ||
           (type == cmState::UTILITY))
          {
          std::string name = target->GetName();
          if(emittedTargets.insert(name).second)
            {
            path = "... ";
            path += name;
            lg->AppendEcho(commands,path.c_str());
            }
          }
        }
      }
    }
  std::vector<std::string> const& localHelp = lg->GetLocalHelp();
  for(std::vector<std::string>::const_iterator o = localHelp.begin();
      o != localHelp.end(); ++o)
    {
    path = "... ";
    path += *o;
    lg->AppendEcho(commands, path.c_str());
    }
  lg->WriteMakeRule(ruleFileStream, "Help Target",
                    "help",
                    no_depends, commands, true);
  ruleFileStream << "\n\n";
}